

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,wstring *s1,wstring *s2)

{
  pointer pwVar1;
  bool bVar2;
  wstring *this_00;
  
  bVar2 = std::operator!=(s1,s2);
  ResetOutputStream();
  pwVar1 = (strCase->_M_dataplus)._M_p;
  if (!bVar2) {
    wprintf(L"%ls OK",pwVar1);
    wprintf(L"\n");
    return;
  }
  wprintf(L"%ls FAIL\nExpected: %ls\nActual: %ls",pwVar1,(s1->_M_dataplus)._M_p,
          (s2->_M_dataplus)._M_p);
  wprintf(L"\n");
  this_00 = (wstring *)__cxa_allocate_exception(0x20);
  std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
  __cxa_throw(this_00,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::wstring &s1, const std::wstring &s2) {
  if (s1 != s2) {
    dmpDebug(L"%ls FAIL\nExpected: %ls\nActual: %ls",
           dmpPrintable(strCase), dmpPrintable(s1), dmpPrintable(s2));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}